

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O2

char16 * __thiscall Js::CompoundString::GetSz(CompoundString *this)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cch;
  charcount_t cVar3;
  undefined4 *puVar4;
  JavascriptString *this_00;
  Recycler *pRVar5;
  char16_t *buffer;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  bVar2 = JavascriptString::IsFinalized((JavascriptString *)this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,999,"(!IsFinalized())","!IsFinalized()");
    if (!bVar2) goto LAB_00a08916;
    *puVar4 = 0;
  }
  cch = JavascriptString::GetLength((JavascriptString *)this);
  if (cch == 1) {
    if (this->directCharLength != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x3f7,"(HasOnlyDirectChars())","HasOnlyDirectChars()");
      if (!bVar2) goto LAB_00a08916;
      *puVar4 = 0;
    }
    if ((this->lastBlockInfo).charLength != 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x3f8,"(LastBlockCharLength() == 1)","LastBlockCharLength() == 1"
                                 );
      if (!bVar2) {
LAB_00a08916:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    this_00 = CharStringCache::GetStringForChar
                        (&((((this->super_LiteralString).super_JavascriptString.
                             super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                          charStringCache,*(this->lastBlockInfo).buffer.ptr);
    buffer = JavascriptString::UnsafeGetBuffer(this_00);
    (this->lastBlock).ptr = (Block *)0x0;
    (this->lastBlockInfo).buffer.ptr = (void *)0x0;
    (this->lastBlockInfo).charLength = 0;
    (this->lastBlockInfo).charCapacity = 0;
    *(undefined8 *)((long)&(this->lastBlockInfo).charCapacity + 1) = 0;
  }
  else if (cch == 0) {
    (this->lastBlock).ptr = (Block *)0x0;
    (this->lastBlockInfo).buffer.ptr = (void *)0x0;
    (this->lastBlockInfo).charLength = 0;
    (this->lastBlockInfo).charCapacity = 0;
    *(undefined8 *)((long)&(this->lastBlockInfo).charCapacity + 1) = 0;
    buffer = L"";
  }
  else {
    if ((((this->ownsLastBlock == true) && (this->directCharLength == 0xffffffff)) &&
        ((this->lastBlock).ptr == (Block *)0x0)) &&
       (bVar2 = TryAppendGeneric<Js::CompoundString>(L'\0',this), bVar2)) {
      JavascriptString::SetLength((JavascriptString *)this,cch);
      buffer = (char16_t *)(this->lastBlockInfo).buffer.ptr;
    }
    else {
      pRVar5 = ((((((this->super_LiteralString).super_JavascriptString.super_RecyclableObject.type.
                   ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
               recycler;
      cVar3 = JavascriptString::SafeSzSize(cch);
      data.plusSize = (size_t)cVar3;
      local_50 = (undefined1  [8])&char16_t::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_5f72374;
      data.filename._0_4_ = 0x40f;
      pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_50);
      cVar3 = JavascriptString::SafeSzSize(cch);
      buffer = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                         ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeaf,0,(ulong)cVar3);
      buffer[cch] = L'\0';
      JavascriptString::Copy<Js::CompoundString>((JavascriptString *)this,buffer,cch);
      if (buffer[cch] != L'\0') {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x412,"(buffer[totalCharLength] == u\'\\0\')",
                                    "buffer[totalCharLength] == _u(\'\\0\')");
        if (!bVar2) goto LAB_00a08916;
        *puVar4 = 0;
      }
    }
    (this->lastBlock).ptr = (Block *)0x0;
    (this->lastBlockInfo).buffer.ptr = (void *)0x0;
    (this->lastBlockInfo).charLength = 0;
    (this->lastBlockInfo).charCapacity = 0;
    *(undefined8 *)((long)&(this->lastBlockInfo).charCapacity + 1) = 0;
  }
  JavascriptString::SetBuffer((JavascriptString *)this,buffer);
  LiteralStringWithPropertyStringPtr::ConvertString<Js::CompoundString>(this);
  return buffer;
}

Assistant:

const char16 *CompoundString::GetSz()
    {
        Assert(!IsFinalized());

        const CharCount totalCharLength = GetLength();
        switch(totalCharLength)
        {
            case 0:
            {
                Unreference();
                const char16 *const buffer = _u("");
                SetBuffer(buffer);
                LiteralStringWithPropertyStringPtr::ConvertString(this);
                return buffer;
            }

            case 1:
            {
                Assert(HasOnlyDirectChars());
                Assert(LastBlockCharLength() == 1);

                const char16 *const buffer = GetLibrary()->GetCharStringCache().GetStringForChar(LastBlockChars()[0])->UnsafeGetBuffer();
                Unreference();
                SetBuffer(buffer);
                LiteralStringWithPropertyStringPtr::ConvertString(this);
                return buffer;
            }
        }

        if(OwnsLastBlock() && HasOnlyDirectChars() && !lastBlock && TryAppendGeneric(_u('\0'), this)) // GetSz() requires null termination
        {
            // There is no last block. Only the buffer was allocated, and is held in 'lastBlockInfo'. Since this string owns the
            // last block, has only direct chars, and the buffer was allocated directly (buffer pointer is not an internal
            // pointer), there is no need to copy the buffer.
            SetLength(totalCharLength); // terminating null should not count towards the string length
            const char16 *const buffer = LastBlockChars();
            Unreference();
            SetBuffer(buffer);
            LiteralStringWithPropertyStringPtr::ConvertString(this);
            return buffer;
        }

        char16 *const buffer = RecyclerNewArrayLeaf(GetScriptContext()->GetRecycler(), char16, SafeSzSize(totalCharLength));
        buffer[totalCharLength] = _u('\0'); // GetSz() requires null termination
        Copy<CompoundString>(buffer, totalCharLength);
        Assert(buffer[totalCharLength] == _u('\0'));
        Unreference();
        SetBuffer(buffer);
        LiteralStringWithPropertyStringPtr::ConvertString(this);
        return buffer;
    }